

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O2

void wang_landau(uint blocks)

{
  allocator<char> local_28e1;
  string local_28e0;
  string local_28c0;
  string local_28a0;
  string local_2880;
  Histogram<unsigned_int> histogram;
  WangLandauSampler sampler;
  FixedDegreeNetwork network;
  Random rng;
  
  FixedDegreeNetwork::FixedDegreeNetwork(&network,3,blocks);
  Histogram<unsigned_int>::Histogram
            (&histogram,0,network.super_Network.total_triangles / 3,
             network.super_Network.total_triangles / 3);
  Random::Random(&rng,2);
  WangLandauSampler::WangLandauSampler(&sampler,&rng,&histogram,&network.super_Network);
  WangLandauSampler::sample(&sampler,0xf,5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28a0,"histogram_wl_%d.dat",&local_28e1);
  format(&local_2880,&local_28a0,blocks);
  Histogram<unsigned_int>::export_histogram(&histogram,&local_2880);
  std::__cxx11::string::~string((string *)&local_2880);
  std::__cxx11::string::~string((string *)&local_28a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28e0,"entropy_wl_%d.dat",&local_28e1);
  format(&local_28c0,&local_28e0,blocks);
  WangLandauSampler::export_entropy(&sampler,&local_28c0);
  std::__cxx11::string::~string((string *)&local_28c0);
  std::__cxx11::string::~string((string *)&local_28e0);
  WangLandauSampler::~WangLandauSampler(&sampler);
  std::random_device::~random_device(&rng.rd);
  Histogram<unsigned_int>::~Histogram(&histogram);
  Network::~Network(&network.super_Network);
  return;
}

Assistant:

void wang_landau(unsigned int blocks) {
    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(), network.get_triangles());
    Random rng(2);

    WangLandauSampler sampler(rng, histogram, network);
    sampler.sample(15);

    histogram.export_histogram(format("histogram_wl_%d.dat", blocks));
    sampler.export_entropy(format("entropy_wl_%d.dat", blocks));
}